

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O1

int ffpknj(fitsfile *fptr,char *keyroot,int nstart,int nkey,long *value,char **comm,int *status)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  char tcomment [73];
  char keyname [75];
  char local_d8 [80];
  char local_88 [88];
  
  iVar3 = *status;
  if (iVar3 < 1) {
    if (comm == (char **)0x0) {
      local_d8[0] = '\0';
LAB_001ba5c7:
      bVar2 = false;
    }
    else {
      pcVar5 = *comm;
      sVar4 = strlen(pcVar5);
      bVar2 = true;
      if (0 < (int)(uint)sVar4) {
        uVar6 = (ulong)((uint)sVar4 & 0x7fffffff);
        do {
          if (pcVar5[uVar6 - 1] != ' ') {
            if (pcVar5[uVar6 - 1] == '&') {
              iVar3 = 0x49;
              if ((int)uVar6 < 0x49) {
                iVar3 = (int)uVar6;
              }
              local_d8[0] = '\0';
              strncat(local_d8,pcVar5,(ulong)(iVar3 - 1));
              goto LAB_001ba5c7;
            }
            break;
          }
          bVar1 = 1 < (long)uVar6;
          uVar6 = uVar6 - 1;
        } while (bVar1);
      }
    }
    if (0 < nkey) {
      uVar6 = 0;
      do {
        ffkeyn(keyroot,nstart + (int)uVar6,local_88,status);
        if (bVar2) {
          pcVar5 = comm[uVar6];
        }
        else {
          pcVar5 = local_d8;
        }
        ffpkyj(fptr,local_88,value[uVar6],pcVar5,status);
        if (0 < *status) {
          return *status;
        }
        uVar6 = uVar6 + 1;
      } while ((uint)nkey != uVar6);
    }
    iVar3 = *status;
  }
  return iVar3;
}

Assistant:

int ffpknj( fitsfile *fptr,     /* I - FITS file pointer                    */
            const char *keyroot,      /* I - root name of keywords to write       */
            int  nstart,        /* I - starting index number                */
            int  nkey,          /* I - number of keywords to write          */
            long *value,        /* I - array of keyword values              */
            char *comm[],       /* I - array of pointers to keyword comment */
            int  *status)       /* IO - error status                        */
/*
  Write (put) an indexed array of keywords with index numbers between
  NSTART and (NSTART + NKEY -1) inclusive.  Write integer keywords
*/
{
    char keyname[FLEN_KEYWORD], tcomment[FLEN_COMMENT];
    int ii, jj, repeat, len;

    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    /* check if first comment string is to be repeated for all the keywords */
    /* by looking to see if the last non-blank character is a '&' char      */

    repeat = 0;

    if (comm)
    {
      len = strlen(comm[0]);

      while (len > 0  && comm[0][len - 1] == ' ')
        len--;                               /* ignore trailing blanks */

      if (len > 0 && comm[0][len - 1] == '&')
      {
        len = minvalue(len, FLEN_COMMENT);
        tcomment[0] = '\0';
        strncat(tcomment, comm[0], len-1); /* don't copy the final '&' char */
        repeat = 1;
      }
    }
    else
    {
      repeat = 1;
      tcomment[0] = '\0';
    }

    for (ii=0, jj=nstart; ii < nkey; ii++, jj++)
    {
        ffkeyn(keyroot, jj, keyname, status);
        if (repeat)
            ffpkyj(fptr, keyname, value[ii], tcomment, status);
        else
            ffpkyj(fptr, keyname, value[ii], comm[ii], status);

        if (*status > 0)
            return(*status);
    }
    return(*status);
}